

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

void __thiscall
absl::lts_20250127::Cord::InlineRep::EmplaceTree
          (InlineRep *this,Nonnull<CordRep_*> rep,MethodIdentifier method)

{
  int64_t sampling_stride;
  
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                  ,0x4e8,
                  "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  (this->data_).rep_.field_0.as_tree.rep = rep;
  (this->data_).rep_.field_0.as_tree.cordz_info = 1;
  sampling_stride = cord_internal::cordz_should_profile();
  if (sampling_stride < 1) {
    return;
  }
  cord_internal::CordzInfo::TrackCord(&this->data_,method,sampling_stride);
  return;
}

Assistant:

inline void Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep*> rep,
                                         MethodIdentifier method) {
  assert(rep);
  data_.make_tree(rep);
  CordzInfo::MaybeTrackCord(data_, method);
}